

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O1

Json __thiscall Client::post(Client *this,string *address,Params *params)

{
  long lVar1;
  Params *in_RCX;
  json_value extraout_RDX;
  Json JVar2;
  Result result;
  Headers headers;
  allocator<char> local_d9;
  undefined1 local_d8 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  string local_98;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  if ((long)address[2]._M_dataplus._M_p < lVar1) {
    requestAccessToken((Client *)address);
  }
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_equal<char_const(&)[13],char_const(&)[17]>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_50,(char (*) [13])"Content-Type",(char (*) [17])"application/json");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 "bearer ",address + 1);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_equal<char_const(&)[14],std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_50,(char (*) [14])0x174fbc,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)local_d8._0_8_ != &local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8._M_impl._0_8_ + 1);
  }
  waitForRateLimit((Client *)address);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,*(char **)&(params->_M_t)._M_impl,&local_d9);
  httplib::ClientImpl::Post
            ((Result *)local_d8,(ClientImpl *)(address->_M_dataplus)._M_p,&local_98,
             (Headers *)&local_50,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  resultChecks((Client *)address,(Result *)local_d8);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  uStack_60 = 0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_d8._0_8_ + 0x78),(parser_callback_t *)&local_78,true,false);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c8);
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)local_d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50);
  JVar2.m_value.object = extraout_RDX.object;
  JVar2._0_8_ = this;
  return JVar2;
}

Assistant:

Json post(const std::string& address, const httplib::Params& params) {
        if (accessTokenExpiration < Clock::now()) {
            requestAccessToken();
        }

        httplib::Headers headers;
        headers.emplace("Content-Type", "application/json");
        headers.emplace("Authorization", "bearer " + accessToken);

        waitForRateLimit();
        httplib::Result result = apiClient.Post(address.c_str(), headers, params);
        resultChecks(result);

        return Json::parse(std::move(result->body));
    }